

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
::product_evaluator(product_evaluator<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                    *this,XprType *xpr)

{
  PlainObject *this_00;
  
  (this->super_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>.m_d.data =
       (float *)0x0;
  this_00 = &this->m_result;
  PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,4,4);
  (this->super_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>.m_d.data =
       (float *)this_00;
  generic_product_impl<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,Eigen::DenseShape,Eigen::DenseShape,3>
  ::evalTo<Eigen::Matrix<float,4,4,0,4,4>>(this_00,xpr->m_lhs,xpr->m_rhs);
  return;
}

Assistant:

explicit product_evaluator(const XprType& xpr)
    : m_result(xpr.rows(), xpr.cols())
  {
    ::new (static_cast<Base*>(this)) Base(m_result);

// FIXME shall we handle nested_eval here?,
// if so, then we must take care at removing the call to nested_eval in the specializations (e.g., in permutation_matrix_product, transposition_matrix_product, etc.)
//     typedef typename internal::nested_eval<Lhs,Rhs::ColsAtCompileTime>::type LhsNested;
//     typedef typename internal::nested_eval<Rhs,Lhs::RowsAtCompileTime>::type RhsNested;
//     typedef typename internal::remove_all<LhsNested>::type LhsNestedCleaned;
//     typedef typename internal::remove_all<RhsNested>::type RhsNestedCleaned;
//
//     const LhsNested lhs(xpr.lhs());
//     const RhsNested rhs(xpr.rhs());
//
//     generic_product_impl<LhsNestedCleaned, RhsNestedCleaned>::evalTo(m_result, lhs, rhs);

    generic_product_impl<Lhs, Rhs, LhsShape, RhsShape, ProductTag>::evalTo(m_result, xpr.lhs(), xpr.rhs());
  }